

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_seqStore_resolveOffCodes
               (repcodes_t *dRepcodes,repcodes_t *cRepcodes,seqStore_t *seqStore,U32 nbSeq)

{
  uint ll0_00;
  uint offCode_00;
  U32 UVar1;
  U32 UVar2;
  seqDef *psVar3;
  repcodes_t rVar4;
  undefined8 local_80;
  U32 local_78;
  undefined8 local_60;
  U32 local_58;
  U32 cRawOffset;
  U32 dRawOffset;
  U32 offCode;
  U32 ll0;
  seqDef *seq;
  U32 idx;
  U32 nbSeq_local;
  seqStore_t *seqStore_local;
  repcodes_t *cRepcodes_local;
  repcodes_t *dRepcodes_local;
  
  for (seq._0_4_ = 0; (uint)seq < nbSeq; seq._0_4_ = (uint)seq + 1) {
    psVar3 = seqStore->sequencesStart + (uint)seq;
    ll0_00 = (uint)(psVar3->litLength == 0);
    offCode_00 = psVar3->offset - 1;
    if (offCode_00 < 3) {
      UVar1 = ZSTD_resolveRepcodeToRawOffset(dRepcodes->rep,offCode_00,ll0_00);
      UVar2 = ZSTD_resolveRepcodeToRawOffset(cRepcodes->rep,offCode_00,ll0_00);
      if (UVar1 != UVar2) {
        psVar3->offset = UVar2 + 3;
      }
    }
    rVar4 = ZSTD_updateRep(dRepcodes->rep,psVar3->offset - 1,ll0_00);
    local_58 = rVar4.rep[2];
    local_60 = rVar4.rep._0_8_;
    dRepcodes->rep[2] = local_58;
    *(undefined8 *)dRepcodes->rep = local_60;
    rVar4 = ZSTD_updateRep(cRepcodes->rep,offCode_00,ll0_00);
    local_80 = rVar4.rep._0_8_;
    local_78 = rVar4.rep[2];
    *(undefined8 *)cRepcodes->rep = local_80;
    cRepcodes->rep[2] = local_78;
  }
  return;
}

Assistant:

static void ZSTD_seqStore_resolveOffCodes(repcodes_t* const dRepcodes, repcodes_t* const cRepcodes,
                                          seqStore_t* const seqStore, U32 const nbSeq) {
    U32 idx = 0;
    for (; idx < nbSeq; ++idx) {
        seqDef* const seq = seqStore->sequencesStart + idx;
        U32 const ll0 = (seq->litLength == 0);
        U32 offCode = seq->offset - 1;
        assert(seq->offset > 0);
        if (offCode <= ZSTD_REP_MOVE) {
            U32 const dRawOffset = ZSTD_resolveRepcodeToRawOffset(dRepcodes->rep, offCode, ll0);
            U32 const cRawOffset = ZSTD_resolveRepcodeToRawOffset(cRepcodes->rep, offCode, ll0);
            /* Adjust simulated decompression repcode history if we come across a mismatch. Replace
             * the repcode with the offset it actually references, determined by the compression
             * repcode history.
             */
            if (dRawOffset != cRawOffset) {
                seq->offset = cRawOffset + ZSTD_REP_NUM;
            }
        }
        /* Compression repcode history is always updated with values directly from the unmodified seqStore.
         * Decompression repcode history may use modified seq->offset value taken from compression repcode history.
         */
        *dRepcodes = ZSTD_updateRep(dRepcodes->rep, seq->offset - 1, ll0);
        *cRepcodes = ZSTD_updateRep(cRepcodes->rep, offCode, ll0);
    }
}